

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

String __thiscall
testing::PrintTestPartResultToString(testing *this,TestPartResult *test_part_result)

{
  testing *this_00;
  TestPartResult *pTVar1;
  size_t sVar2;
  char *extraout_RAX;
  char *pcVar3;
  size_t extraout_RDX;
  ostream *poVar4;
  char *pcVar5;
  long lVar6;
  Message MVar7;
  String SVar8;
  char local_59;
  Message local_58;
  testing *local_50;
  TestPartResult *local_48;
  void *local_40;
  long local_38;
  
  Message::Message(&local_58);
  pcVar5 = (test_part_result->file_name_).c_str_;
  pcVar3 = "unknown file";
  if (pcVar5 != (char *)0x0) {
    pcVar3 = pcVar5;
  }
  if (test_part_result->line_number_ < 0) {
    internal::String::Format((char *)&local_40,"%s:",pcVar3);
  }
  else {
    internal::String::Format((char *)&local_40,"%s:%d:",pcVar3);
  }
  poVar4 = (ostream *)(local_58.ss_ + 0x10);
  if (local_58.ss_ == (StrStream *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  local_50 = this;
  local_48 = test_part_result;
  if (local_40 == (void *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(null)",6);
  }
  else if (local_38 != 0) {
    lVar6 = 0;
    do {
      if (*(char *)((long)local_40 + lVar6) == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\\0",2);
      }
      else {
        local_59 = *(char *)((long)local_40 + lVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_59,1);
      }
      lVar6 = lVar6 + 1;
    } while (local_38 != lVar6);
  }
  poVar4 = (ostream *)(local_58.ss_ + 0x10);
  if (local_58.ss_ == (StrStream *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  pTVar1 = local_48;
  if ((ulong)local_48->type_ < 3) {
    pcVar5 = &DAT_00171a14 + *(int *)(&DAT_00171a14 + (ulong)local_48->type_ * 4);
  }
  else {
    pcVar5 = "Unknown result type";
  }
  poVar4 = (ostream *)(local_58.ss_ + 0x10);
  if (local_58.ss_ == (StrStream *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  sVar2 = strlen(pcVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,sVar2);
  this_00 = local_50;
  pcVar5 = (pTVar1->message_).c_str_;
  if (pcVar5 == (char *)0x0) {
    MVar7.ss_ = local_58.ss_ + 0x10;
    sVar2 = 6;
    pcVar5 = "(null)";
  }
  else {
    MVar7.ss_ = local_58.ss_;
    if (local_58.ss_ != (StrStream *)0x0) {
      MVar7.ss_ = (StrStream *)(local_58.ss_ + 0x10);
    }
    sVar2 = strlen(pcVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)MVar7.ss_,pcVar5,sVar2);
  SVar8 = internal::StrStreamToString((internal *)this_00,local_58.ss_);
  if (local_40 != (void *)0x0) {
    operator_delete__(local_40);
    SVar8.length_ = extraout_RDX;
    SVar8.c_str_ = extraout_RAX;
  }
  if (local_58.ss_ != (StrStream *)0x0) {
    SVar8 = (String)(**(code **)(*(long *)local_58.ss_ + 8))();
  }
  return SVar8;
}

Assistant:

static internal::String PrintTestPartResultToString(
    const TestPartResult& test_part_result) {
  return (Message()
          << internal::FormatFileLocation(test_part_result.file_name(),
                                          test_part_result.line_number())
          << " " << TestPartResultTypeToString(test_part_result.type())
          << test_part_result.message()).GetString();
}